

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

int Gia_ManEquivCountLits(Gia_Man_t *p)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  
  iVar3 = 0;
  if ((p->pReprs != (Gia_Rpr_t *)0x0) && (piVar2 = p->pNexts, iVar3 = 0, piVar2 != (int *)0x0)) {
    iVar3 = p->nObjs;
    iVar4 = 0;
    if (1 < (long)iVar3) {
      iVar4 = 0;
      lVar6 = 1;
      iVar7 = 0;
      do {
        uVar8 = (uint)p->pReprs[lVar6] & 0xfffffff;
        if ((uVar8 == 0xfffffff) && (0 < piVar2[lVar6])) {
          iVar7 = iVar7 + 1;
        }
        else if (uVar8 != 0) {
          uVar5 = 0;
          if (uVar8 == 0xfffffff) {
            uVar5 = (uint)(piVar2[lVar6] == 0);
          }
          iVar4 = iVar4 + uVar5;
        }
        lVar6 = lVar6 + 1;
      } while (iVar3 != lVar6);
      iVar4 = iVar4 + iVar7;
    }
    iVar7 = p->vCos->nSize;
    iVar1 = p->vCis->nSize;
    iVar3 = (iVar3 - iVar4) + iVar7 + iVar1 + ~(iVar1 + iVar7);
  }
  return iVar3;
}

Assistant:

int Gia_ManEquivCountLits( Gia_Man_t * p )
{
    int i, Counter = 0, Counter0 = 0, CounterX = 0;
    if ( p->pReprs == NULL || p->pNexts == NULL )
        return 0;
    for ( i = 1; i < Gia_ManObjNum(p); i++ )
    {
        if ( Gia_ObjIsHead(p, i) )
            Counter++;
        else if ( Gia_ObjIsConst(p, i) )
            Counter0++;
        else if ( Gia_ObjIsNone(p, i) )
            CounterX++;
    }
    CounterX -= Gia_ManCoNum(p);
    return Gia_ManCiNum(p) + Gia_ManAndNum(p) - Counter - CounterX;
}